

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::parse_str_into(char *ext,char *str,size_t len,int radix)

{
  bool bVar1;
  size_t *psVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  size_t sVar6;
  size_t *val;
  int in_ECX;
  char *in_RDX;
  size_t *in_RDI;
  char *tt;
  char dreg [7];
  int d;
  wchar_t ch;
  int significant;
  char *t2;
  char *t1;
  char *tmp;
  uint thdl;
  int neg;
  size_t rem;
  utf8_ptr p;
  size_t prec;
  int inferred_radix;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar8;
  size_t *in_stack_ffffffffffffff88;
  undefined5 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff95;
  undefined2 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  size_t *ext_00;
  undefined4 in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  int iVar9;
  
  iVar9 = 0;
  if (in_ECX == 0) {
    iVar9 = radix_from_string((char *)CONCAT44(in_stack_ffffffffffffff9c,
                                               CONCAT13(in_stack_ffffffffffffff9b,
                                                        CONCAT21(in_stack_ffffffffffffff99,
                                                                 (char)((uint)
                                                  in_stack_ffffffffffffff95 >> 0x18)))),
                              CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90));
    in_ECX = iVar9;
  }
  if (in_ECX == 10) {
    parse_str_into((char *)CONCAT44(10,iVar9),in_stack_ffffffffffffffd8,
                   (size_t)in_stack_ffffffffffffffd0);
  }
  else {
    sVar6 = get_prec((char *)0x2beba3);
    set_type((char *)in_RDI,0);
    memset((char *)((long)in_RDI + 5),0,sVar6 + 1 >> 1);
    utf8_ptr::utf8_ptr((utf8_ptr *)
                       CONCAT17(in_stack_ffffffffffffff87,
                                CONCAT16(in_stack_ffffffffffffff86,
                                         CONCAT24(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80))),
                       in_stack_ffffffffffffff78);
    while( true ) {
      uVar8 = false;
      if (in_RDX != (char *)0x0) {
        utf8_ptr::getch((utf8_ptr *)0x2bec07);
        iVar3 = is_space(L'\0');
        uVar8 = iVar3 != 0;
      }
      if ((bool)uVar8 == false) break;
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
    iVar3 = 0;
    if ((in_RDX == (char *)0x0) || (wVar4 = utf8_ptr::getch((utf8_ptr *)0x2bec4f), wVar4 != L'+')) {
      if ((in_RDX != (char *)0x0) && (wVar4 = utf8_ptr::getch((utf8_ptr *)0x2bec77), wVar4 == L'-'))
      {
        iVar3 = 1;
        utf8_ptr::inc((utf8_ptr *)
                      CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
      }
    }
    else {
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
    while( true ) {
      uVar7 = false;
      if (in_RDX != (char *)0x0) {
        utf8_ptr::getch((utf8_ptr *)0x2becaf);
        iVar5 = is_space(L'\0');
        uVar7 = iVar5 != 0;
      }
      if ((bool)uVar7 == false) break;
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
    if ((((iVar9 == 0x10) && (in_RDX != (char *)0x0)) &&
        (wVar4 = utf8_ptr::getch((utf8_ptr *)0x2becf6), wVar4 == L'0')) &&
       ((wVar4 = utf8_ptr::getch_at((utf8_ptr *)
                                    CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff84
                                                                           ,
                                                  in_stack_ffffffffffffff80))),
                                    (size_t)in_stack_ffffffffffffff78), wVar4 == L'x' ||
        (wVar4 = utf8_ptr::getch_at((utf8_ptr *)
                                    CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff84
                                                                           ,
                                                  in_stack_ffffffffffffff80))),
                                    (size_t)in_stack_ffffffffffffff78), wVar4 == L'X')))) {
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
    val = (size_t *)
          alloc_temp_reg(CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                         (uint *)in_stack_ffffffffffffff88);
    bVar1 = false;
    ext_00 = in_RDI;
    while (in_RDX != (char *)0x0) {
      wVar4 = utf8_ptr::getch((utf8_ptr *)0x2bed8a);
      if ((wVar4 < L'0') || (L'9' < wVar4)) {
        if ((wVar4 < L'A') || (L'Z' < wVar4)) {
          if ((wVar4 < L'a') || (L'z' < wVar4)) break;
          iVar9 = wVar4 + L'\xffffffa9';
        }
        else {
          iVar9 = wVar4 + L'\xffffffc9';
        }
      }
      else {
        iVar9 = wVar4 + L'\xffffffd0';
      }
      if (in_ECX <= iVar9) break;
      if (wVar4 != L'0') {
        bVar1 = true;
      }
      psVar2 = val;
      if (bVar1) {
        in_stack_ffffffffffffff95 = 2;
        set_uint_val((char *)CONCAT35(2,in_stack_ffffffffffffff90),(ulong)in_stack_ffffffffffffff88)
        ;
        mul_by_long((char *)ext_00,(unsigned_long)val);
        in_stack_ffffffffffffff88 = ext_00;
        compute_abs_sum_into
                  (in_stack_ffffffffffffffd0,in_RDX,
                   (char *)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
        psVar2 = in_stack_ffffffffffffff88;
        ext_00 = val;
      }
      val = psVar2;
      utf8_ptr::inc((utf8_ptr *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff88);
    }
    if (ext_00 != in_RDI) {
      copy_val((char *)CONCAT35((int3)in_stack_ffffffffffffff95,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,
               CONCAT13(uVar8,CONCAT12(uVar7,in_stack_ffffffffffffff84)));
    }
    release_temp_reg(0);
    set_neg((char *)in_RDI,iVar3);
  }
  return;
}

Assistant:

void CVmObjBigNum::parse_str_into(char *ext, const char *str, size_t len,
                                  int radix)
{
    /* if the radix is 0, infer the radix from the string */
    int inferred_radix = 0;
    if (radix == 0)
        radix = inferred_radix = radix_from_string(str, len);
    
    /* if it's decimal, parse as a floating point value */
    if (radix == 10)
    {
        parse_str_into(ext, str, len);
        return;
    }

    /* get the precision */
    size_t prec = get_prec(ext);

    /* set the initial value to zero */
    set_type(ext, VMBN_T_NUM);
    memset(ext + VMBN_MANT, 0, (prec + 1)/2);

    /* set up to scan the string */
    utf8_ptr p((char *)str);
    size_t rem = len;

    /* skip leading spaces */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* check for a sign */
    int neg = FALSE;
    if (rem != 0 && p.getch() == '+')
    {
        /* skip the sign */
        p.inc(&rem);
    }
    else if (rem != 0 && p.getch() == '-')
    {
        /* note the sign and skip it */
        neg = TRUE;
        p.inc(&rem);
    }

    /* skip spaces after the sign */
    for ( ; rem != 0 && is_space(p.getch()) ; p.inc(&rem)) ;

    /* if we inferred the radix as hax, skip any '0x' marker */
    if (inferred_radix == 16
        && rem != 0
        && p.getch() == '0'
        && (p.getch_at(1) == 'x' || p.getch_at(1) == 'X'))
    {
        /* skip the '0x' prefix */
        p.inc(&rem);
        p.inc(&rem);
    }

    /* allocate a temporary register for swapping with the accumulator */
    uint thdl;
    char *tmp = alloc_temp_reg(prec, &thdl);
    char *t1 = ext, *t2 = tmp;

    /* parse the digits */
    int significant = FALSE;
    for ( ; rem != 0 ; p.inc(&rem))
    {
        /* get the next character */
        wchar_t ch = p.getch();

        /* get the digit value of this character */
        int d;
        if (ch >= '0' && ch <= '9')
            d = ch - '0';
        else if (ch >= 'A' && ch <= 'Z')
            d = ch - 'A' + 10;
        else if (ch >= 'a' && ch <= 'z')
            d = ch - 'a' + 10;
        else
            break;

        /* if the digit isn't within the radix, it's not a digit after all */
        if (d >= radix)
            break;

        /* if it's not a leading zero, it's significant */
        if (ch != '0')
            significant = TRUE;

        /* if it's a significant digit, add it to the accumulator */
        if (significant)
        {
            /* 
             *   Set up a stack register with the digit value.  The radix can
             *   be up to 36, so the digit value can be up to 35, so we need
             *   up to two decimal digits to represent the digit value. 
             */
            char dreg[5 + 2] = { 2, 0, 0, 0, 0 };
            set_uint_val(dreg, d);

            /* shift the accumulator and add the digit */
            mul_by_long(t1, radix);
            compute_abs_sum_into(t2, t1, dreg);

            /* swap the accumulators */
            char *tt = t1;
            t1 = t2;
            t2 = tt;
        }
    }

    /* if we ended up with the value in 'tmp', copy it into our result */
    if (t1 != ext)
        copy_val(ext, t1, FALSE);

    /* free our temporary register */
    release_temp_reg(thdl);

    /* set the sign */
    set_neg(ext, neg);
}